

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.h
# Opt level: O3

void __thiscall WangLandauSampler::sample(WangLandauSampler *this,uint total_steps,uint round_trips)

{
  Histogram<unsigned_int> *pHVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  if (total_steps != 0) {
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"w-l step: ",10);
      uVar4 = uVar4 + 1;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      (*((this->super_UniformSampler).super_Sampler.histogram)->_vptr_Histogram[2])();
      uVar3 = round_trips;
      if (round_trips != 0) {
        do {
          perform_round_trip(this);
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      this->f = this->f * 0.5;
      pHVar1 = (this->super_UniformSampler).super_Sampler.histogram;
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"tmp.dat","");
      (*pHVar1->_vptr_Histogram[4])(pHVar1,(string *)local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"entropy_tmp.dat","");
      export_entropy(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    } while (uVar4 != total_steps);
  }
  return;
}

Assistant:

void sample(unsigned int total_steps, unsigned int round_trips=5) {
        for (unsigned int step = 0; step < total_steps; step++) {
            std::cout << "w-l step: " << step + 1 << "/" << total_steps << std::endl;
            histogram.reset();
            for (unsigned int round_trip = 0; round_trip < round_trips; round_trip++)
                perform_round_trip();
            wang_landau_step();

            histogram.export_histogram("tmp.dat");
            export_entropy("entropy_tmp.dat");
            }
    }